

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FigureTests-v2.cpp
# Opt level: O3

void __thiscall
v2::FigureTests_v2_square_clone_method_called_via_base_class_return_pointer_of_type_Figure_Test::
TestBody(FigureTests_v2_square_clone_method_called_via_base_class_return_pointer_of_type_Figure_Test
         *this)

{
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8;
  
  local_8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FigureTests_v2, square_clone_method_called_via_base_class_return_pointer_of_type_Figure)
{
    auto  square = Square{};
    auto& square_figure = static_cast<Figure&>(square);
    auto  figure = clone(square_figure);

    ASSERT_TRUE((std::is_same<std::unique_ptr<Figure>, decltype(figure)>::value));
}